

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos,float radius)

{
  ImDrawList *pIVar1;
  ImU32 IVar2;
  float radius_00;
  ImGuiCol local_d4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  float local_6c;
  ImVec2 IStack_68;
  float cross_extent;
  ImVec2 center;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  undefined1 local_38 [8];
  ImRect bb;
  ImGuiWindow *window;
  float radius_local;
  ImVec2 *pos_local;
  ImGuiID id_local;
  
  bb.Max = (ImVec2)GetCurrentWindow();
  ImVec2::ImVec2(&local_48,radius,radius);
  local_40 = ::operator-(pos,&local_48);
  ImVec2::ImVec2((ImVec2 *)&col,radius,radius);
  local_50 = ::operator+(pos,(ImVec2 *)&col);
  ImRect::ImRect((ImRect *)local_38,&local_40,&local_50);
  center.y._1_1_ =
       ButtonBehavior((ImRect *)local_38,id,(bool *)((long)&center.y + 3),
                      (bool *)((long)&center.y + 2),0);
  if (((center.y._2_1_ & 1) == 0) || ((center.y._3_1_ & 1) == 0)) {
    local_d4 = 0x22;
    if ((center.y._3_1_ & 1) != 0) {
      local_d4 = 0x23;
    }
  }
  else {
    local_d4 = 0x24;
  }
  center.x = (float)GetColorU32(local_d4,1.0);
  IStack_68 = ImRect::GetCenter((ImRect *)local_38);
  pIVar1 = *(ImDrawList **)((long)bb.Max + 0x290);
  radius_00 = ImMax(2.0,radius);
  ImDrawList::AddCircleFilled(pIVar1,&stack0xffffffffffffff98,radius_00,(ImU32)center.x,0xc);
  local_6c = radius * 0.7071 + -1.0;
  if ((center.y._3_1_ & 1) != 0) {
    pIVar1 = *(ImDrawList **)((long)bb.Max + 0x290);
    ImVec2::ImVec2(&local_7c,local_6c,local_6c);
    local_74 = ::operator+(&stack0xffffffffffffff98,&local_7c);
    ImVec2::ImVec2(&local_8c,-local_6c,-local_6c);
    local_84 = ::operator+(&stack0xffffffffffffff98,&local_8c);
    IVar2 = GetColorU32(0,1.0);
    ImDrawList::AddLine(pIVar1,&local_74,&local_84,IVar2,1.0);
    pIVar1 = *(ImDrawList **)((long)bb.Max + 0x290);
    ImVec2::ImVec2(&local_9c,local_6c,-local_6c);
    local_94 = ::operator+(&stack0xffffffffffffff98,&local_9c);
    ImVec2::ImVec2(&local_ac,-local_6c,local_6c);
    local_a4 = ::operator+(&stack0xffffffffffffff98,&local_ac);
    IVar2 = GetColorU32(0,1.0);
    ImDrawList::AddLine(pIVar1,&local_94,&local_a4,IVar2,1.0);
  }
  return (bool)(center.y._1_1_ & 1);
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos, float radius)
{
    ImGuiWindow* window = GetCurrentWindow();

    const ImRect bb(pos - ImVec2(radius,radius), pos + ImVec2(radius,radius));

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_CloseButtonActive : hovered ? ImGuiCol_CloseButtonHovered : ImGuiCol_CloseButton);
    const ImVec2 center = bb.GetCenter();
    window->DrawList->AddCircleFilled(center, ImMax(2.0f, radius), col, 12);

    const float cross_extent = (radius * 0.7071f) - 1.0f;
    if (hovered)
    {
        window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), GetColorU32(ImGuiCol_Text));
        window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), GetColorU32(ImGuiCol_Text));
    }

    return pressed;
}